

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void __thiscall
Test::Assertion::Assertion(Assertion *this,char *fileName,uint32_t lineNum,string *userMsg)

{
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  std::__cxx11::string::string((string *)this,"",&local_39);
  std::__cxx11::string::string((string *)&this->file,fileName,&local_3a);
  local_38 = &this->file;
  std::__cxx11::string::string((string *)&this->method,"",&local_3b);
  std::__cxx11::string::string((string *)&this->args,"",&local_3c);
  std::__cxx11::string::string((string *)&this->errorMessage,"",&local_3d);
  std::__cxx11::string::string((string *)&this->userMessage,userMsg);
  this->lineNumber = lineNum;
  return;
}

Assistant:

Assertion::Assertion(const char *fileName, uint32_t lineNum, const std::string &userMsg)
    : suite(""), file(fileName), method(""), args(""), errorMessage(""), userMessage(userMsg),
      lineNumber(lineNum) {}